

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void ComputeHistogramCost(VP8LHistogram *h)

{
  uint64_t uVar1;
  uint16_t *trivial_sym;
  long lVar2;
  int length;
  uint32_t *population;
  int local_3c;
  uint32_t *local_38;
  
  trivial_sym = h->trivial_symbol;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    GetPopulationInfo(h,(HistogramIndex)lVar2,&local_38,&local_3c);
    uVar1 = PopulationCost(local_38,local_3c,trivial_sym,h->is_used + lVar2);
    h->costs[lVar2] = uVar1;
    trivial_sym = trivial_sym + 1;
  }
  h->bit_cost = h->costs[3] + h->costs[1] + h->costs[2] + h->costs[0] + h->costs[4];
  return;
}

Assistant:

static void ComputeHistogramCost(VP8LHistogram* const h) {
  int i;
  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    const uint32_t* population;
    int length;
    GetPopulationInfo(h, i, &population, &length);
    h->costs[i] = PopulationCost(population, length, &h->trivial_symbol[i],
                                 &h->is_used[i]);
  }
  h->bit_cost = h->costs[LITERAL] + h->costs[RED] + h->costs[BLUE] +
                h->costs[ALPHA] + h->costs[DISTANCE];
}